

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcconn.c
# Opt level: O0

void ipc_error(void *arg,int err)

{
  bool bVar1;
  undefined8 local_28;
  nni_aio *aio;
  ipc_conn *c;
  int err_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
  while( true ) {
    local_28 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x70));
    bVar1 = true;
    if (local_28 == (nni_aio *)0x0) {
      local_28 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x88));
      bVar1 = local_28 != (nni_aio *)0x0;
    }
    if (!bVar1) break;
    nni_aio_list_remove(local_28);
    nni_aio_finish_error(local_28,err);
  }
  nni_posix_pfd_close((nni_posix_pfd *)((long)arg + 0x38));
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
  return;
}

Assistant:

static void
ipc_error(void *arg, int err)
{
	ipc_conn *c = arg;
	nni_aio  *aio;

	nni_mtx_lock(&c->mtx);
	while (((aio = nni_list_first(&c->readq)) != NULL) ||
	    ((aio = nni_list_first(&c->writeq)) != NULL)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, err);
	}
	nni_posix_pfd_close(&c->pfd);
	nni_mtx_unlock(&c->mtx);
}